

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

void DrawLineStrip(Vector2 *points,int pointsCount,Color color)

{
  ulong uVar1;
  ulong uVar2;
  
  if (1 < pointsCount) {
    rlCheckRenderBatchLimit(pointsCount);
    rlBegin(1);
    rlColor4ub(color.r,color.g,color.b,color.a);
    uVar2 = 0;
    do {
      rlVertex2f(points[uVar2].x,points[uVar2].y);
      uVar1 = uVar2 + 1;
      rlVertex2f(points[uVar2 + 1].x,points[uVar2 + 1].y);
      uVar2 = uVar1;
    } while (pointsCount - 1 != uVar1);
    rlEnd();
    return;
  }
  return;
}

Assistant:

void DrawLineStrip(Vector2 *points, int pointsCount, Color color)
{
    if (pointsCount >= 2)
    {
        rlCheckRenderBatchLimit(pointsCount);

        rlBegin(RL_LINES);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 0; i < pointsCount - 1; i++)
            {
                rlVertex2f(points[i].x, points[i].y);
                rlVertex2f(points[i + 1].x, points[i + 1].y);
            }
        rlEnd();
    }
}